

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool __thiscall ON_RTree::Insert(ON_RTree *this,double *a_min,double *a_max,void *a_element_id)

{
  ON_RTreeNode *pOVar1;
  bool bVar2;
  ON_RTreeBBox rect;
  ON_RTreeBBox local_48;
  
  local_48.m_min[2] = a_min[2];
  local_48.m_min[0] = *a_min;
  local_48.m_min[1] = a_min[1];
  local_48.m_max[0] = *a_max;
  local_48.m_max[1] = a_max[1];
  local_48.m_max[2] = a_max[2];
  if (((local_48.m_max[0] < local_48.m_min[0]) || (local_48.m_max[1] < local_48.m_min[1])) ||
     (local_48.m_max[2] < local_48.m_min[2])) {
    bVar2 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
               ,0x3dd,"","ON_RTree::Insert - invalid a_min[] or a_max[] input.");
  }
  else {
    if (this->m_root == (ON_RTreeNode *)0x0) {
      pOVar1 = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
      this->m_root = pOVar1;
      pOVar1->m_level = 0;
    }
    InsertRect(this,&local_48,(ON__INT_PTR)a_element_id,&this->m_root,0);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ON_RTree::Insert(const double a_min[ON_RTree_NODE_DIM], const double a_max[ON_RTree_NODE_DIM], void* a_element_id)
{
  bool rc;
  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,sizeof(rect.m_min));
  memcpy(rect.m_max,a_max,sizeof(rect.m_max));
  if ( rect.m_min[0] <= rect.m_max[0] && rect.m_min[1] <= rect.m_max[1] && rect.m_min[2] <= rect.m_max[2] )
  {  
    if ( 0 == m_root )
    {
      m_root = m_mem_pool.AllocNode();
      m_root->m_level = 0;
    }

    // The ON__INT_PTR cast is safe because ON__INT_PTR == sizeof(void*)
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4311: 'type cast' : pointer truncation from 'void *' to 'ON__INT_PTR'
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4311 )
#endif
    InsertRect(&rect, (ON__INT_PTR)a_element_id, &m_root, 0);
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif

    rc = true;
  }
  else
  {
    // invalid bounding box - don't let this corrupt the tree
    rc = false;
    ON_ERROR("ON_RTree::Insert - invalid a_min[] or a_max[] input.");
  }
  return rc;
}